

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O3

void __thiscall myGame::Game::Game(Game *this,int height,int weight)

{
  pointer ppOVar1;
  char **ppcVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  Game *this_00;
  Snake local_50;
  Point local_20;
  
  (this->snake).body.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->snake).body.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->snake).body.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lr_window).x = 0;
  (this->lr_window).y = 0;
  this->W = weight;
  this->H = height;
  local_20.x = 0;
  local_20.y = 0;
  Snake::Snake(&local_50,&local_20,&Point::dir_left);
  (this->snake).head = local_50.head;
  (this->snake).tail = local_50.tail;
  ppOVar1 = (this->snake).body.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  (this->snake).body.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_50.body.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->snake).body.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_50.body.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->snake).body.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_50.body.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_50.body.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.body.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.body.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppOVar1 == (pointer)0x0) {
    (this->snake).alive = local_50.alive;
    *(undefined3 *)&(this->snake).field_0x29 = local_50._41_3_;
    (this->snake).points = local_50.points;
  }
  else {
    operator_delete(ppOVar1);
    (this->snake).alive = local_50.alive;
    *(undefined3 *)&(this->snake).field_0x29 = local_50._41_3_;
    (this->snake).points = local_50.points;
    if (local_50.body.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.body.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  this_00 = (Game *)(ulong)(uint)this->W;
  ppcVar2 = getMap(this->W,this->H);
  this->map = ppcVar2;
  iVar6 = 3000;
  do {
    getFood(this_00);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  this->points = 0;
  iVar6 = this->H;
  if (0 < iVar6) {
    uVar4 = (ulong)(uint)this->W;
    lVar3 = 0;
    do {
      if (0 < (int)uVar4) {
        lVar5 = 0;
        do {
          this->map[lVar3][lVar5] = '.';
          lVar5 = lVar5 + 1;
          uVar4 = (ulong)this->W;
        } while (lVar5 < (long)uVar4);
        iVar6 = this->H;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar6);
  }
  return;
}

Assistant:

Game::Game(int height, int weight){
	W = weight;
	H = height;
	snake = Snake(Point(0, 0), Point::dir_left);
	map = getMap(W, H);
	for (int i = 0; i < 3000; i++){
		getFood();
	}
	points = 0;
	for (int i = 0; i < H; i++){
		for (int j = 0; j < W; j++){
			map[i][j] = CHR_NOTHING;
			// map2[i][j] = map[i][j];
		}
	}
}